

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromDar(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  Abc_Ntk_t *pAVar6;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x1a5,"Abc_Ntk_t *Abc_NtkFromDar(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pNtkOld->nBarBufs;
  pAVar1 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar1;
  for (iVar5 = 0; iVar5 < pMan->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pMan->vCis,iVar5);
    pAVar1 = Abc_NtkCi(pNtk,iVar5);
    *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar1;
    *(uint *)&pAVar1->field_0x14 =
         *(uint *)&pAVar1->field_0x14 & 0xfff |
         (uint)(*(ulong *)((long)pvVar2 + 0x18) >> 0x14) & 0xfffff000;
  }
  p = Aig_ManDfs(pMan,1);
  for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar5);
    if ((*(uint *)&pAVar3->field_0x18 & 7) == 4) {
      pAVar1 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
    }
    else {
      pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar1 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
      pAVar4 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar3);
      pAVar1 = Abc_AigAnd(pMan_00,pAVar1,pAVar4);
    }
    (pAVar3->field_5).pData = pAVar1;
  }
  Vec_PtrFree(p);
  for (iVar5 = 0; iVar5 < pMan->vCos->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar5);
    if ((pMan->nAsserts != 0) && (iVar5 == pMan->nObjs[3] - pMan->nAsserts)) break;
    pAVar1 = Abc_NtkCo(pNtk,iVar5);
    pAVar4 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
    Abc_ObjAddFanin(pAVar1,pAVar4);
  }
  pAVar6 = pNtk;
  iVar5 = Abc_NtkCheck(pNtk);
  if (iVar5 == 0) {
    Abc_Print((int)pAVar6,"Abc_NtkFromDar(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDar( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj;
    int i;
    assert( pMan->nAsserts == 0 );
//    assert( Aig_ManRegNum(pMan) == Abc_NtkLatchNum(pNtkOld) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
    {
        pObj->pData = Abc_NtkCi(pNtkNew, i);
        // initialize logic level of the CIs
        ((Abc_Obj_t *)pObj->pData)->Level = pObj->Level;
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        if ( pMan->nAsserts && i == Aig_ManCoNum(pMan) - pMan->nAsserts )
            break;
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    }
    // if there are assertions, add them
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );
//Abc_NtkPrintCiLevels( pNtkNew );
    return pNtkNew;
}